

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

void __thiscall arm::MemoryOperand::display(MemoryOperand *this,ostream *o)

{
  variant<arm::RegisterOperand,_short> *pvVar1;
  MemoryAccessKind MVar2;
  __index_type _Var3;
  long lVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"[",1);
  display_reg_name(o,this->r1);
  MVar2 = this->kind;
  if (MVar2 == PostIndex) {
    std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
    pvVar1 = &this->offset;
    _Var3 = *(__index_type *)
             ((long)&(this->offset).super__Variant_base<arm::RegisterOperand,_short>.
                     super__Move_assign_alias<arm::RegisterOperand,_short>.
                     super__Copy_assign_alias<arm::RegisterOperand,_short>.
                     super__Move_ctor_alias<arm::RegisterOperand,_short>.
                     super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                     super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10);
    if (_Var3 == '\0') {
      if (this->neg_rm == true) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"-",1);
      }
      (*(code *)**(undefined8 **)
                  &(pvVar1->super__Variant_base<arm::RegisterOperand,_short>).
                   super__Move_assign_alias<arm::RegisterOperand,_short>.
                   super__Copy_assign_alias<arm::RegisterOperand,_short>.
                   super__Move_ctor_alias<arm::RegisterOperand,_short>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                   super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u)(pvVar1,o);
    }
    else if (_Var3 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(o,"#",1);
      std::ostream::operator<<
                (o,*(short *)&(pvVar1->super__Variant_base<arm::RegisterOperand,_short>).
                              super__Move_assign_alias<arm::RegisterOperand,_short>.
                              super__Copy_assign_alias<arm::RegisterOperand,_short>.
                              super__Move_ctor_alias<arm::RegisterOperand,_short>.
                              super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                              super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u);
    }
    pcVar5 = "]!";
    lVar4 = 2;
LAB_001b6191:
    std::__ostream_insert<char,std::char_traits<char>>(o,pcVar5,lVar4);
    return;
  }
  if (MVar2 == PreIndex) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"], ",3);
    pvVar1 = &this->offset;
    _Var3 = *(__index_type *)
             ((long)&(this->offset).super__Variant_base<arm::RegisterOperand,_short>.
                     super__Move_assign_alias<arm::RegisterOperand,_short>.
                     super__Copy_assign_alias<arm::RegisterOperand,_short>.
                     super__Move_ctor_alias<arm::RegisterOperand,_short>.
                     super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                     super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10);
    if (_Var3 == '\0') {
      if (this->neg_rm == true) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"-",1);
      }
      (*(code *)**(undefined8 **)
                  &(pvVar1->super__Variant_base<arm::RegisterOperand,_short>).
                   super__Move_assign_alias<arm::RegisterOperand,_short>.
                   super__Copy_assign_alias<arm::RegisterOperand,_short>.
                   super__Move_ctor_alias<arm::RegisterOperand,_short>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                   super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u)(pvVar1,o);
      return;
    }
    if (_Var3 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(o,"#",1);
      std::ostream::operator<<
                (o,*(short *)&(pvVar1->super__Variant_base<arm::RegisterOperand,_short>).
                              super__Move_assign_alias<arm::RegisterOperand,_short>.
                              super__Copy_assign_alias<arm::RegisterOperand,_short>.
                              super__Move_ctor_alias<arm::RegisterOperand,_short>.
                              super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                              super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u);
      return;
    }
  }
  else if (MVar2 == None) {
    std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
    pvVar1 = &this->offset;
    _Var3 = *(__index_type *)
             ((long)&(this->offset).super__Variant_base<arm::RegisterOperand,_short>.
                     super__Move_assign_alias<arm::RegisterOperand,_short>.
                     super__Copy_assign_alias<arm::RegisterOperand,_short>.
                     super__Move_ctor_alias<arm::RegisterOperand,_short>.
                     super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                     super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10);
    if (_Var3 == '\0') {
      if (this->neg_rm == true) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"-",1);
      }
      (*(code *)**(undefined8 **)
                  &(pvVar1->super__Variant_base<arm::RegisterOperand,_short>).
                   super__Move_assign_alias<arm::RegisterOperand,_short>.
                   super__Copy_assign_alias<arm::RegisterOperand,_short>.
                   super__Move_ctor_alias<arm::RegisterOperand,_short>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                   super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u)(pvVar1,o);
    }
    else if (_Var3 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>(o,"#",1);
      std::ostream::operator<<
                (o,*(short *)&(pvVar1->super__Variant_base<arm::RegisterOperand,_short>).
                              super__Move_assign_alias<arm::RegisterOperand,_short>.
                              super__Copy_assign_alias<arm::RegisterOperand,_short>.
                              super__Move_ctor_alias<arm::RegisterOperand,_short>.
                              super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                              super__Variant_storage_alias<arm::RegisterOperand,_short>._M_u);
    }
    pcVar5 = "]";
    lVar4 = 1;
    goto LAB_001b6191;
  }
  return;
}

Assistant:

void MemoryOperand::display(std::ostream &o) const {
  auto display_offset = [&](std::ostream &o) {
    if (auto x = std::get_if<RegisterOperand>(&offset)) {
      if (neg_rm) o << "-";
      o << *x;
    } else if (auto x = std::get_if<int16_t>(&offset)) {
      o << "#" << *x;
    }
  };
  o << "[";
  display_reg_name(o, r1);
  switch (kind) {
    case MemoryAccessKind::None:
      o << ", ";
      display_offset(o);
      o << "]";
      break;
    case MemoryAccessKind::PostIndex:
      o << ", ";
      display_offset(o);
      o << "]!";
      break;
    case MemoryAccessKind::PreIndex:
      o << "], ";
      display_offset(o);
      break;
  }
}